

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void CVmImageLoader::load_resources_from_fp(osfildef *fp,char *fname,CVmImageLoaderMres *res_ifc)

{
  long lVar1;
  void *pvVar2;
  CVmFile *this;
  long *in_FS_OFFSET;
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  err_frame_t err_cur__;
  CVmImageLoader *local_118;
  CVmImageFile *local_110;
  uint local_108 [2];
  long local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  
  local_110 = (CVmImageFile *)0x0;
  local_118 = (CVmImageLoader *)0x0;
  this = (CVmFile *)operator_new(0x10);
  this->fp_ = fp;
  this->seek_base_ = 0;
  G_err_frame::__tls_init();
  local_100 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_108;
  local_108[0] = _setjmp(&local_f0);
  if (local_108[0] == 0) {
    local_110 = (CVmImageFile *)operator_new(0x20);
    local_110->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_003233e8;
    local_110[1]._vptr_CVmImageFile = (_func_int **)this;
    local_110[2]._vptr_CVmImageFile = (_func_int **)0x0;
    local_110[3]._vptr_CVmImageFile = (_func_int **)0x0;
    local_118 = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader(local_118,local_110,fname,0);
    load_resource_file(local_118,res_ifc);
  }
  if (-1 < (short)local_108[0]) {
    local_108[0] = local_108[0] | 0x8000;
    this->fp_ = (osfildef *)0x0;
    if (local_118 != (CVmImageLoader *)0x0) {
      if (local_118 != (CVmImageLoader *)0x0) {
        ~CVmImageLoader(local_118);
      }
      operator_delete(local_118,0x98);
    }
    if ((local_110 != (CVmImageFile *)0x0) && (local_110 != (CVmImageFile *)0x0)) {
      (*local_110->_vptr_CVmImageFile[1])();
    }
    CVmFile::~CVmFile(this);
    operator_delete(this,0x10);
  }
  lVar1 = local_100;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_108[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_f8;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_108[0] & 2) != 0) {
    free(local_f8);
  }
  return;
}

Assistant:

void CVmImageLoader::load_resources_from_fp(osfildef *fp,
                                            const char *fname,
                                            CVmImageLoaderMres *res_ifc)
{
    CVmFile *file;
    CVmImageFile *volatile imagefp = 0;
    CVmImageLoader *volatile loader = 0;

    /* create a file object for reading the file */
    file = new CVmFile();

    /* set up the file with our file handler */
    file->set_file(fp, 0);
    
    err_try
    {
        /* set up the loader */
        imagefp = new CVmImageFileExt(file);
        loader = new CVmImageLoader(imagefp, fname, 0);

        /* load the resource-only file */
        loader->load_resource_file(res_ifc);
    }